

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_qcache.c
# Opt level: O2

void ares_qcache_expire(ares_qcache_t *cache,ares_timeval_t *now)

{
  ares_slist_node_t *node;
  undefined8 *puVar1;
  
  if (cache != (ares_qcache_t *)0x0) {
    while ((node = ares_slist_node_first(cache->expire), node != (ares_slist_node_t *)0x0 &&
           ((puVar1 = (undefined8 *)ares_slist_node_val(node), now == (ares_timeval_t *)0x0 ||
            ((long)puVar1[2] <= now->sec))))) {
      ares_htable_strvp_remove(cache->cache,(char *)*puVar1);
      ares_slist_node_destroy(node);
    }
  }
  return;
}

Assistant:

static void ares_qcache_expire(ares_qcache_t *cache, const ares_timeval_t *now)
{
  ares_slist_node_t *node;

  if (cache == NULL) {
    return;
  }

  while ((node = ares_slist_node_first(cache->expire)) != NULL) {
    const ares_qcache_entry_t *entry = ares_slist_node_val(node);

    /* If now is NULL, we're flushing everything, so don't break */
    if (now != NULL && entry->expire_ts > now->sec) {
      break;
    }

    ares_htable_strvp_remove(cache->cache, entry->key);
    ares_slist_node_destroy(node);
  }
}